

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::FiberBase::FiberBase
          (FiberBase *this,FiberPool *pool,ExceptionOrValue *result,SourceLocation location)

{
  Disposer local_38;
  FiberStack *local_30;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00673320;
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00672d70;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_00672dc0;
  this->state = WAITING;
  this->currentInner = (OwnPromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  (this->stack).disposer = (Disposer *)0x0;
  (this->stack).ptr = (FiberStack *)0x0;
  this->result = result;
  FiberPool::Impl::takeStack((Impl *)&stack0xffffffffffffffc8);
  Own<kj::_::FiberStack,_std::nullptr_t>::operator=
            (&this->stack,(Own<kj::_::FiberStack,_std::nullptr_t> *)&stack0xffffffffffffffc8);
  if (local_30 != (FiberStack *)0x0) {
    local_30 = (FiberStack *)0x0;
    (**(code **)*local_38._vptr_Disposer)();
  }
  FiberStack::initialize((this->stack).ptr,this);
  return;
}

Assistant:

FiberBase::FiberBase(const FiberPool& pool, _::ExceptionOrValue& result, SourceLocation location)
    : Event(location), state(WAITING), result(result) {
  stack = pool.impl->takeStack();
  stack->initialize(*this);
  ensureThreadCanRunFibers();
}